

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::defaultListTests
               (ostream *out,ColourImpl *streamColour,
               vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
               bool isFiltered,Verbosity verbosity)

{
  bool bVar1;
  reference this;
  TestCaseInfo *this_00;
  ColourGuard *rhs;
  Column *pCVar2;
  size_type sVar3;
  ostream *poVar4;
  StringRef label;
  pluralise local_1b0;
  StringRef local_198;
  pluralise local_188;
  string local_170;
  Column local_150;
  string local_118;
  Column local_f8;
  Column local_c0;
  ColourGuard local_78;
  undefined1 local_68 [8];
  ColourGuard colourGuard;
  Code colour;
  TestCaseInfo *testCaseInfo;
  TestCaseHandle *test;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range1;
  Verbosity verbosity_local;
  bool isFiltered_local;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests_local;
  ColourImpl *streamColour_local;
  ostream *out_local;
  
  if (verbosity == Quiet) {
    anon_unknown_26::listTestNamesOnly(out,tests);
  }
  else {
    if (isFiltered) {
      std::operator<<(out,"Matching test cases:\n");
    }
    else {
      std::operator<<(out,"All available test cases:\n");
    }
    __end1 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                       (tests);
    test = (TestCaseHandle *)
           std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end(tests);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                                  *)&test);
      if (!bVar1) break;
      this = __gnu_cxx::
             __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
             ::operator*(&__end1);
      this_00 = TestCaseHandle::getTestCaseInfo(this);
      bVar1 = TestCaseInfo::isHidden(this_00);
      colourGuard.m_engaged = false;
      colourGuard._13_3_ = 0;
      if (bVar1) {
        colourGuard.m_engaged = true;
        colourGuard._13_3_ = 0;
      }
      ColourImpl::guardColour((ColourImpl *)&local_78,(Code)streamColour);
      rhs = ColourImpl::ColourGuard::engage(&local_78,out);
      ColourImpl::ColourGuard::ColourGuard((ColourGuard *)local_68,rhs);
      ColourImpl::ColourGuard::~ColourGuard(&local_78);
      TextFlow::Column::Column(&local_c0,&this_00->name);
      pCVar2 = TextFlow::Column::indent(&local_c0,2);
      poVar4 = TextFlow::operator<<(out,pCVar2);
      std::operator<<(poVar4,'\n');
      TextFlow::Column::~Column(&local_c0);
      if (1 < (int)verbosity) {
        Detail::stringify<Catch::SourceLineInfo>(&local_118,&this_00->lineInfo);
        TextFlow::Column::Column(&local_f8,&local_118);
        pCVar2 = TextFlow::Column::indent(&local_f8,4);
        poVar4 = TextFlow::operator<<(out,pCVar2);
        std::operator<<(poVar4,'\n');
        TextFlow::Column::~Column(&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
      }
      bVar1 = std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::empty(&this_00->tags);
      if ((!bVar1) && (0 < (int)verbosity)) {
        TestCaseInfo::tagsAsString_abi_cxx11_(&local_170,this_00);
        TextFlow::Column::Column(&local_150,&local_170);
        pCVar2 = TextFlow::Column::indent(&local_150,6);
        poVar4 = TextFlow::operator<<(out,pCVar2);
        std::operator<<(poVar4,'\n');
        TextFlow::Column::~Column(&local_150);
        std::__cxx11::string::~string((string *)&local_170);
      }
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_68);
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
      ::operator++(&__end1);
    }
    if (isFiltered) {
      sVar3 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size
                        (tests);
      local_198 = operator____sr("matching test case",0x12);
      pluralise::pluralise(&local_188,sVar3,local_198);
      operator<<(out,&local_188);
    }
    else {
      sVar3 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size
                        (tests);
      label = operator____sr("test case",9);
      pluralise::pluralise(&local_1b0,sVar3,label);
      operator<<(out,&local_1b0);
    }
    poVar4 = std::operator<<(out,"\n\n");
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void defaultListTests(std::ostream& out, ColourImpl* streamColour, std::vector<TestCaseHandle> const& tests, bool isFiltered, Verbosity verbosity) {
        // We special case this to provide the equivalent of old
        // `--list-test-names-only`, which could then be used by the
        // `--input-file` option.
        if (verbosity == Verbosity::Quiet) {
            listTestNamesOnly(out, tests);
            return;
        }

        if (isFiltered) {
            out << "Matching test cases:\n";
        } else {
            out << "All available test cases:\n";
        }

        for (auto const& test : tests) {
            auto const& testCaseInfo = test.getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            auto colourGuard = streamColour->guardColour( colour ).engage( out );

            out << TextFlow::Column(testCaseInfo.name).indent(2) << '\n';
            if (verbosity >= Verbosity::High) {
                out << TextFlow::Column(Catch::Detail::stringify(testCaseInfo.lineInfo)).indent(4) << '\n';
            }
            if (!testCaseInfo.tags.empty() &&
                verbosity > Verbosity::Quiet) {
                out << TextFlow::Column(testCaseInfo.tagsAsString()).indent(6) << '\n';
            }
        }

        if (isFiltered) {
            out << pluralise(tests.size(), "matching test case"_sr);
        } else {
            out << pluralise(tests.size(), "test case"_sr);
        }
        out << "\n\n" << std::flush;
    }